

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exception.cpp
# Opt level: O0

void __thiscall argo::json_exception::json_exception(json_exception *this,exception_type et)

{
  exception_type et_local;
  json_exception *this_local;
  
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__json_exception_00132978;
  this->m_type = et;
  switch(et) {
  case invalid_json_type_e:
    strncpy(this->m_message,"internal error, invalid json instance type",200);
    break;
  default:
    strncpy(this->m_message,"generic",200);
    break;
  case not_number_e:
    strncpy(this->m_message,"instance is not a number",200);
    break;
  case cant_compare_raw_e:
    strncpy(this->m_message,"raw values can\'t be compared",200);
    break;
  case cant_cast_raw_e:
    strncpy(this->m_message,"raw values can\'t be cast",200);
    break;
  case pointer_not_matched_e:
    strncpy(this->m_message,"pointer doesn\'t match a location in the instance",200);
    break;
  case pointer_token_type_invalid_e:
    strncpy(this->m_message,"pointer token type is invalid",200);
  }
  return;
}

Assistant:

json_exception::json_exception(exception_type et) noexcept : exception(), m_type(et)
{
    switch (et)
    {
    case invalid_json_type_e:
        strncpy(m_message, "internal error, invalid json instance type", max_message_length);
        break;
    case not_number_e:
        strncpy(m_message, "instance is not a number", max_message_length);
        break;
    case cant_compare_raw_e:
        strncpy(m_message, "raw values can't be compared", max_message_length);
        break;
    case cant_cast_raw_e:
        strncpy(m_message, "raw values can't be cast", max_message_length);
        break;
    case pointer_not_matched_e:
        strncpy(m_message, "pointer doesn't match a location in the instance", max_message_length);
        break;
    case pointer_token_type_invalid_e:
        strncpy(m_message, "pointer token type is invalid", max_message_length);
        break;
    default:
        strncpy(m_message, "generic", max_message_length);
        break;
    }
}